

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O0

uint16_t get_attr_pos(lyd_attr *attr,lyd_node *parent)

{
  lyd_attr *local_28;
  lyd_attr *attr2;
  uint16_t pos;
  lyd_node *parent_local;
  lyd_attr *attr_local;
  
  attr2._6_2_ = 0;
  for (local_28 = parent->attr; local_28 != (lyd_attr *)0x0 && local_28 != attr;
      local_28 = local_28->next) {
    attr2._6_2_ = attr2._6_2_ + 1;
  }
  if (local_28 != (lyd_attr *)0x0) {
    return attr2._6_2_;
  }
  __assert_fail("attr2",
                "/workspace/llm4binary/github/license_all_cmakelists_25/RIFTIO[P]libyang/src/xpath.c"
                ,0x48b,"uint16_t get_attr_pos(struct lyd_attr *, const struct lyd_node *)");
}

Assistant:

static uint16_t
get_attr_pos(struct lyd_attr *attr, const struct lyd_node *parent)
{
    uint16_t pos = 0;
    struct lyd_attr *attr2;

    for (attr2 = parent->attr; attr2 && (attr2 != attr); attr2 = attr2->next) {
        ++pos;
    }

    assert(attr2);
    return pos;
}